

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

void * mi_heap_calloc_aligned_at
                 (mi_heap_t *heap,size_t count,size_t size,size_t alignment,size_t offset)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  void *pvVar4;
  
  if ((count == 1) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = count, auVar2._8_8_ = 0, auVar2._0_8_ = size,
     size = SUB168(auVar1 * auVar2,0), SUB168(auVar1 * auVar2,8) == 0)) {
    bVar3 = false;
  }
  else {
    bVar3 = true;
    size = 0xffffffffffffffff;
  }
  if (!bVar3) {
    pvVar4 = mi_heap_malloc_zero_aligned_at(heap,size,alignment,offset,true);
    return pvVar4;
  }
  return (void *)0x0;
}

Assistant:

static inline bool mi_count_size_overflow(size_t count, size_t size, size_t* total) {
  if (count==1) {  // quick check for the case where count is one (common for C++ allocators)
    *total = size;
    return false;
  }
  else if mi_unlikely(mi_mul_overflow(count, size, total)) {
    #if MI_DEBUG > 0
    _mi_error_message(EOVERFLOW, "allocation request is too large (%zu * %zu bytes)\n", count, size);
    #endif
    *total = SIZE_MAX;
    return true;
  }
  else return false;
}